

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void __thiscall
leveldb::DBTest_GetLevel0Ordering_Test::DBTest_GetLevel0Ordering_Test
          (DBTest_GetLevel0Ordering_Test *this)

{
  DBTest::DBTest(&this->super_DBTest);
  (this->super_DBTest).super_Test._vptr_Test = (_func_int **)&PTR__DBTest_00194c70;
  return;
}

Assistant:

TEST_F(DBTest, GetLevel0Ordering) {
  do {
    // Check that we process level-0 files in correct order.  The code
    // below generates two level-0 files where the earlier one comes
    // before the later one in the level-0 file list since the earlier
    // one has a smaller "smallest" key.
    ASSERT_LEVELDB_OK(Put("bar", "b"));
    ASSERT_LEVELDB_OK(Put("foo", "v1"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_LEVELDB_OK(Put("foo", "v2"));
    dbfull()->TEST_CompactMemTable();
    ASSERT_EQ("v2", Get("foo"));
  } while (ChangeOptions());
}